

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O1

void nng_http_read_response(nng_http *conn,nng_aio *aio)

{
  nni_http_read_res(conn,aio);
  return;
}

Assistant:

void
nng_http_read_response(nng_http *conn, nng_aio *aio)
{
#ifdef NNG_SUPP_HTTP
	nni_http_read_res(conn, aio);
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(res);
	nni_aio_finish_error(aio, NNG_ENOTSUP);
#endif
}